

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O1

UText * __thiscall
icu_63::RegexMatcher::group
          (RegexMatcher *this,int32_t groupNum,UText *dest,int64_t *group_len,UErrorCode *status)

{
  int iVar1;
  UVector32 *pUVar2;
  long index;
  UErrorCode UVar3;
  int iVar4;
  int64_t *piVar5;
  long lVar6;
  UText *pUVar7;
  int64_t *piVar8;
  
  *group_len = 0;
  if (U_ZERO_ERROR < *status) {
    return dest;
  }
  UVar3 = this->fDeferredStatus;
  if (UVar3 < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->fMatch == '\0') {
      UVar3 = U_REGEX_INVALID_STATE;
    }
    else {
      UVar3 = U_INDEX_OUTOFBOUNDS_ERROR;
      if ((-1 < groupNum) && (groupNum <= this->fPattern->fGroupMap->count)) goto LAB_0023db31;
    }
  }
  *status = UVar3;
LAB_0023db31:
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (groupNum == 0) {
      piVar8 = &this->fMatchStart;
      piVar5 = &this->fMatchEnd;
    }
    else {
      iVar4 = 0;
      if ((0 < groupNum) &&
         (pUVar2 = this->fPattern->fGroupMap, iVar1 = pUVar2->count, groupNum <= iVar1 && 0 < iVar1)
         ) {
        iVar4 = pUVar2->elements[(ulong)(uint)groupNum - 1];
      }
      piVar8 = this->fFrame->fExtra + iVar4;
      piVar5 = this->fFrame[1].fExtra + (long)iVar4 + -2;
    }
    index = *piVar8;
    if (index < 0) {
      pUVar7 = utext_clone_63(dest,this->fInputText,'\0','\x01',status);
      return pUVar7;
    }
    *group_len = *piVar5 - index;
    dest = utext_clone_63(dest,this->fInputText,'\0','\x01',status);
    if (dest != (UText *)0x0) {
      lVar6 = index - dest->chunkNativeStart;
      if (((lVar6 < 0) || (dest->nativeIndexingLimit <= lVar6)) ||
         (0xdbff < (ushort)dest->chunkContents[lVar6])) {
        utext_setNativeIndex_63(dest,index);
      }
      else {
        dest->chunkOffset = (int32_t)lVar6;
      }
    }
  }
  return dest;
}

Assistant:

UText *RegexMatcher::group(int32_t groupNum, UText *dest, int64_t &group_len, UErrorCode &status) const {
    group_len = 0;
    if (U_FAILURE(status)) {
        return dest;
    }
    if (U_FAILURE(fDeferredStatus)) {
        status = fDeferredStatus;
    } else if (fMatch == FALSE) {
        status = U_REGEX_INVALID_STATE;
    } else if (groupNum < 0 || groupNum > fPattern->fGroupMap->size()) {
        status = U_INDEX_OUTOFBOUNDS_ERROR;
    }

    if (U_FAILURE(status)) {
        return dest;
    }

    int64_t s, e;
    if (groupNum == 0) {
        s = fMatchStart;
        e = fMatchEnd;
    } else {
        int32_t groupOffset = fPattern->fGroupMap->elementAti(groupNum-1);
        U_ASSERT(groupOffset < fPattern->fFrameSize);
        U_ASSERT(groupOffset >= 0);
        s = fFrame->fExtra[groupOffset];
        e = fFrame->fExtra[groupOffset+1];
    }

    if (s < 0) {
        // A capture group wasn't part of the match
        return utext_clone(dest, fInputText, FALSE, TRUE, &status);
    }
    U_ASSERT(s <= e);
    group_len = e - s;

    dest = utext_clone(dest, fInputText, FALSE, TRUE, &status);
    if (dest)
        UTEXT_SETNATIVEINDEX(dest, s);
    return dest;
}